

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O1

float ImGui::TableGetHeaderAngledMaxLabelWidth(void)

{
  float fVar1;
  ImGuiTable *pIVar2;
  ImGuiTableColumn *pIVar3;
  ImGuiContext *pIVar4;
  long lVar5;
  char *text;
  ulong uVar6;
  long lVar7;
  uint uVar8;
  ImVec2 IVar9;
  float fVar10;
  
  pIVar4 = GImGui;
  pIVar2 = GImGui->CurrentTable;
  if (pIVar2->ColumnsCount < 1) {
    fVar10 = 0.0;
  }
  else {
    fVar10 = 0.0;
    lVar7 = 0;
    uVar6 = 0;
    do {
      if (((pIVar2->EnabledMaskByIndex[uVar6 >> 5 & 0x7ffffff] >> ((uint)uVar6 & 0x1f) & 1) != 0) &&
         (pIVar3 = (pIVar2->Columns).Data, (*(byte *)((long)&pIVar3->Flags + lVar7 + 2) & 4) != 0))
      {
        if ((pIVar2->IsLayoutLocked != false) ||
           (text = "", (long)uVar6 < (long)pIVar2->DeclColumnsCount)) {
          lVar5 = (long)*(short *)((long)&pIVar3->NameOffset + lVar7);
          text = "";
          if (lVar5 != -1) {
            text = (pIVar2->ColumnsNames).Buf.Data + lVar5;
          }
        }
        IVar9 = CalcTextSize(text,(char *)0x0,true,-1.0);
        uVar8 = -(uint)(IVar9.x <= fVar10);
        fVar10 = (float)(uVar8 & (uint)fVar10 | ~uVar8 & (uint)IVar9.x);
      }
      uVar6 = uVar6 + 1;
      lVar7 = lVar7 + 0x70;
    } while ((long)uVar6 < (long)pIVar2->ColumnsCount);
  }
  fVar1 = (pIVar4->Style).CellPadding.y;
  return fVar1 + fVar1 + fVar10;
}

Assistant:

float ImGui::TableGetHeaderAngledMaxLabelWidth()
{
    ImGuiContext& g = *GImGui;
    ImGuiTable* table = g.CurrentTable;
    float width = 0.0f;
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
        if (IM_BITARRAY_TESTBIT(table->EnabledMaskByIndex, column_n))
            if (table->Columns[column_n].Flags & ImGuiTableColumnFlags_AngledHeader)
                width = ImMax(width, CalcTextSize(TableGetColumnName(table, column_n), NULL, true).x);
    return width + g.Style.CellPadding.y * 2.0f; // Swap padding
}